

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::AddPropagateStatistics::Operation<short,duckdb::TryAddOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  int iVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  long value;
  short sVar6;
  short sVar7;
  int64_t iVar8;
  Value local_70;
  
  sVar2 = NumericStats::GetMin<short>(lstats);
  sVar3 = NumericStats::GetMin<short>(rstats);
  iVar1 = (int)sVar3 + (int)sVar2;
  sVar7 = (short)iVar1;
  iVar8 = 1;
  if (sVar7 == iVar1) {
    sVar4 = NumericStats::GetMax<short>(lstats);
    sVar5 = NumericStats::GetMax<short>(rstats);
    sVar6 = (short)((int)sVar5 + (int)sVar4);
    if ((int)sVar6 == (int)sVar5 + (int)sVar4) {
      iVar8 = 0;
      value = (long)sVar7;
      if (0xffff < (int)sVar3 + (int)sVar2 + 0x8000U) {
        value = iVar8;
      }
      Value::Numeric(&local_70,type,value);
      Value::operator=(new_min,&local_70);
      Value::~Value(&local_70);
      Value::Numeric(&local_70,type,(long)sVar6);
      Value::operator=(new_max,&local_70);
      Value::~Value(&local_70);
    }
  }
  return SUB81(iVar8,0);
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}